

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

void __thiscall
TArray<FMugShotFrame,_FMugShotFrame>::DoCopy
          (TArray<FMugShotFrame,_FMugShotFrame> *this,TArray<FMugShotFrame,_FMugShotFrame> *other)

{
  uint uVar1;
  FMugShotFrame *pFVar2;
  FMugShotFrame *pFVar3;
  ulong uVar4;
  long lVar5;
  
  uVar1 = other->Count;
  this->Count = uVar1;
  this->Most = uVar1;
  if ((ulong)uVar1 == 0) {
    this->Array = (FMugShotFrame *)0x0;
  }
  else {
    pFVar3 = (FMugShotFrame *)
             M_Malloc_Dbg((ulong)uVar1 * 0x18,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/./tarray.h"
                          ,0x199);
    this->Array = pFVar3;
    if (this->Count != 0) {
      lVar5 = 0;
      uVar4 = 0;
      do {
        pFVar3 = this->Array;
        pFVar2 = other->Array;
        TArray<FString,_FString>::DoCopy
                  ((TArray<FString,_FString> *)((long)&(pFVar3->Graphic).Array + lVar5),
                   (TArray<FString,_FString> *)((long)&(pFVar2->Graphic).Array + lVar5));
        *(undefined4 *)((long)&pFVar3->Delay + lVar5) =
             *(undefined4 *)((long)&pFVar2->Delay + lVar5);
        uVar4 = uVar4 + 1;
        lVar5 = lVar5 + 0x18;
      } while (uVar4 < this->Count);
    }
  }
  return;
}

Assistant:

void DoCopy (const TArray<T> &other)
	{
		Most = Count = other.Count;
		if (Count != 0)
		{
			Array = (T *)M_Malloc (sizeof(T)*Most);
			for (unsigned int i = 0; i < Count; ++i)
			{
				::new(&Array[i]) T(other.Array[i]);
			}
		}
		else
		{
			Array = NULL;
		}
	}